

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  TestProperty *local_78;
  TestProperty *property;
  undefined4 local_68;
  int i;
  string local_60 [8];
  string kProperty;
  string local_38 [8];
  string kProperties;
  TestResult *result_local;
  ostream *stream_local;
  
  kProperties.field_2._8_8_ = result;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"properties",(allocator<char> *)(kProperty.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(kProperty.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"property",(allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  iVar1 = TestResult::test_property_count((TestResult *)kProperties.field_2._8_8_);
  if (iVar1 < 1) {
    local_68 = 1;
  }
  else {
    poVar3 = std::operator<<(stream,"<");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    property._4_4_ = 0;
    while( true ) {
      iVar1 = property._4_4_;
      iVar2 = TestResult::test_property_count((TestResult *)kProperties.field_2._8_8_);
      if (iVar2 <= iVar1) break;
      local_78 = TestResult::GetTestProperty((TestResult *)kProperties.field_2._8_8_,property._4_4_)
      ;
      poVar3 = std::operator<<(stream,"<");
      std::operator<<(poVar3,local_60);
      poVar3 = std::operator<<(stream," name=\"");
      pcVar4 = TestProperty::key(local_78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar4,&local_b9);
      EscapeXmlAttribute(&local_98,&local_b8);
      poVar3 = std::operator<<(poVar3,(string *)&local_98);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      poVar3 = std::operator<<(stream," value=\"");
      pcVar4 = TestProperty::value(local_78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar4,&local_101);
      EscapeXmlAttribute(&local_e0,&local_100);
      poVar3 = std::operator<<(poVar3,(string *)&local_e0);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::operator<<(stream,"/>\n");
      property._4_4_ = property._4_4_ + 1;
    }
    poVar3 = std::operator<<(stream,"</");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    local_68 = 0;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "<" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "</" << kProperties << ">\n";
}